

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.h
# Opt level: O2

void __thiscall
slang::ast::ConstraintList::visitExprs<netlist::VariableReferenceVisitor&>
          (ConstraintList *this,VariableReferenceVisitor *visitor)

{
  pointer ppCVar1;
  size_t sVar2;
  long lVar3;
  
  ppCVar1 = (this->list)._M_ptr;
  sVar2 = (this->list)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    Constraint::visit<netlist::VariableReferenceVisitor>
              (*(Constraint **)((long)ppCVar1 + lVar3),visitor);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto item : list)
            item->visit(visitor);
    }